

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqrtf.h
# Opt level: O2

float sqrtf_10(float x)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = 0.0;
  fVar3 = x;
  while( true ) {
    fVar2 = fVar3 * 0.5;
    if ((fVar2 == fVar1) && (!NAN(fVar2) && !NAN(fVar1))) break;
    fVar3 = x / fVar2 + fVar2;
    fVar1 = fVar2;
  }
  return fVar2;
}

Assistant:

float sqrtf_10(const float x)
{
    float n = x / 2.0;
    float lstX = 0.0;
    while (n != lstX)
    {
        lstX = n;
        n = (n + x / n) / 2.0;
    }
    return n;
}